

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optate.c
# Opt level: O2

void miller_loop(GT *rop,G1 *P,G2 *Q,ATE_CTX *ctx)

{
  fp_struct_st *p;
  fp2_struct_st *pfVar1;
  fp2_struct_st *op1;
  G2 *op2;
  long lVar2;
  fp2_t r2;
  fp2_t tmp0;
  fp2_t tmp7;
  fp2_t tmp4;
  G2 r;
  fp2_t z2;
  fp2_t tmp2;
  fp2_t tmp1;
  fp2_t tmp5;
  G2 t;
  fp2_t dummy;
  fp2_t tmp3;
  G2 minusQ;
  fp12_t dummy2;
  fp12_t dummy1;
  fp6_t tfp62;
  
  fp12_setone(rop,ctx->rp);
  G2_set(&r,Q);
  G2_set(&minusQ,Q);
  p = ctx->p;
  fp2_neg(minusQ.m_y,minusQ.m_y,p);
  fp2_square(r2,Q->m_y,ctx);
  lVar2 = 1;
  do {
    if (ctx->naf_len <= lVar2) {
      G2_frobenius(&t,Q,ctx);
      pfVar1 = t.m_y;
      fp2_square(r2,pfVar1,ctx);
      linefunction_add_ate(dummy1,&r,&r,&t,P,r2,ctx);
      G2_frobenius(&t,&t,ctx);
      fp2_neg(pfVar1,pfVar1,p);
      fp2_square(r2,pfVar1,ctx);
      linefunction_add_ate(dummy2,&r,&r,&t,P,r2,ctx);
      fp12_mul_sparse2(dummy1,dummy1,dummy2,ctx);
      fp12_mul(rop,rop,dummy1,ctx);
      return;
    }
    fp2_square(z2,r.m_z,ctx);
    fp2_square(tmp0,r.m_x,ctx);
    fp2_square(tmp1,r.m_y,ctx);
    fp2_square(tmp2,tmp1,ctx);
    fp2_add(tmp3,r.m_x,tmp1,p);
    fp2_square(tmp3,tmp3,ctx);
    fp2_sub(tmp3,tmp3,tmp0,p);
    fp2_sub(tmp3,tmp3,tmp2,p);
    fp2_double(tmp3,tmp3,p);
    fp_triple(tmp4,tmp0,p);
    fp_triple(tmp4[0].m_b,tmp0[0].m_b,p);
    fp2_add(tmp7,tmp4,r.m_x,p);
    fp2_square(tmp5,tmp4,ctx);
    fp2_sub(r.m_x,tmp5,tmp3,p);
    fp2_sub(r.m_x,r.m_x,tmp3,p);
    pfVar1 = r.m_z;
    op1 = r.m_y;
    fp2_add(pfVar1,op1,pfVar1,p);
    fp2_square(pfVar1,pfVar1,ctx);
    fp2_sub(pfVar1,pfVar1,tmp1,p);
    fp2_sub(pfVar1,pfVar1,z2,p);
    fp2_sub(op1,tmp3,r.m_x,p);
    fp2_mul(op1,op1,tmp4,ctx);
    fp2_double(dummy,tmp2,p);
    fp2_double(dummy,dummy,p);
    fp2_double(dummy,dummy,p);
    fp2_sub(op1,op1,dummy,p);
    fp2_mul(tmp3,tmp4,z2,ctx);
    fp2_double(tmp3,tmp3,p);
    fp2_neg(tmp3,tmp3,p);
    fp2_mul_fp(tmp3,tmp3,P->m_x,ctx);
    fp2_square(tmp7,tmp7,ctx);
    fp2_sub(tmp7,tmp7,tmp0,p);
    fp2_sub(tmp7,tmp7,tmp5,p);
    fp2_double(dummy,tmp1,p);
    fp2_double(dummy,dummy,p);
    fp2_sub(tmp7,tmp7,dummy,p);
    fp2_mul(tmp0,r.m_z,z2,ctx);
    fp2_double(tmp0,tmp0,p);
    fp2_mul_fp(tmp0,tmp0,P->m_y,ctx);
    fp2_setzero(tmp1);
    fp6_set_fp2((fp6_struct_st *)&t,tmp1,tmp7,tmp3);
    fp6_set_fp2(tfp62,tmp1,tmp1,tmp0);
    fp12_set_fp6(dummy1,(fp6_struct_st *)&t,tfp62);
    fp12_square(rop,rop,ctx);
    fp12_mul_sparse1(rop,rop,dummy1,ctx);
    if (ctx->naf[lVar2] == -1) {
      op2 = &minusQ;
LAB_0011bb2e:
      linefunction_add_ate(dummy2,&r,&r,op2,P,r2,ctx);
      fp12_mul_sparse1(rop,rop,dummy2,ctx);
    }
    else {
      op2 = Q;
      if (ctx->naf[lVar2] == 1) goto LAB_0011bb2e;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void miller_loop(GT *rop, const G1 *P, const G2 *Q, const ATE_CTX *ctx)
{
    // P and Q are assumed to be in affine coordinates!
    fp12_t dummy1, dummy2;
    G2 r, t, minusQ;
    fp2_t r2;
    int i;

    fp12_setone(rop, ctx->rp);

    G2_set(&r, Q);

    G2_set(&minusQ, Q);
    fp2_neg(minusQ.m_y, minusQ.m_y, ctx->p);
    fp2_square(r2, Q->m_y, ctx);

    for (i = 1; i < ctx->naf_len; i++) {
        linefunction_double_ate(dummy1, &r, &r, P, ctx);

        fp12_square(rop, rop, ctx);
        fp12_mul_sparse1(rop, rop, dummy1, ctx);

        if (ctx->naf[i] == 1) {
            linefunction_add_ate(dummy2, &r, &r, Q, P, r2, ctx);
            // fp12_mul_sparse2(dummy1, dummy1, dummy2, ctx);
            fp12_mul_sparse1(rop, rop, dummy2, ctx);
        }
        else if (ctx->naf[i] == -1) {
            linefunction_add_ate(dummy2, &r, &r, &minusQ, P, r2, ctx);
            // fp12_mul_sparse2(dummy1, dummy1, dummy2, ctx);
            fp12_mul_sparse1(rop, rop, dummy2, ctx);
        }
        // fp12_mul(rop, rop, dummy1, ctx);
    }

    G2_frobenius(&t, Q, ctx);
    fp2_square(r2, t.m_y, ctx);
    linefunction_add_ate(dummy1, &r, &r, &t, P, r2, ctx);

    G2_frobenius(&t, &t, ctx);
    fp2_neg(t.m_y, t.m_y, ctx->p);
    fp2_square(r2, t.m_y, ctx);
    linefunction_add_ate(dummy2, &r, &r, &t, P, r2, ctx);

    fp12_mul_sparse2(dummy1, dummy1, dummy2, ctx);
    fp12_mul(rop, rop, dummy1, ctx);
}